

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_keyboard_info_request.c
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  int iVar3;
  long lVar4;
  int malloc_call_num;
  undefined8 uStack_38;
  
  lVar4 = 0;
  iVar3 = 1;
  iVar2 = 0;
  uStack_38 = in_RAX;
  do {
    iVar1 = test_case(iVar3,*(char **)((long)&test_cases[0].data + lVar4),
                      *(int *)((long)&test_cases[0].data_len + lVar4),(void *)0x0,
                      *(expected *)((long)&test_cases[0].expected.rc + lVar4));
    if (iVar1 != 0) {
      iVar2 = 1;
    }
    lVar4 = lVar4 + 0x20;
    iVar3 = iVar3 + 1;
  } while (lVar4 != 0x200);
  iVar3 = 0x11;
  lVar4 = 0;
  do {
    uStack_38 = CONCAT44(iVar3 + -0xe,(undefined4)uStack_38);
    iVar1 = test_case(iVar3,*(char **)((long)&failed_malloc_test_cases[0].data + lVar4),
                      *(int *)((long)&failed_malloc_test_cases[0].data_len + lVar4),
                      (void *)((long)&uStack_38 + 4),
                      *(expected *)((long)&failed_malloc_test_cases[0].expected.rc + lVar4));
    if (iVar1 != 0) {
      iVar2 = 1;
    }
    iVar3 = iVar3 + 1;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 == 0x20);
  return iVar2;
}

Assistant:

int main(void)
{
    int ret = 0;
    int i;

    for(i = 0; i < TEST_CASES_LEN; i++) {
        if(test_case(i + 1,
                     test_cases[i].data,
                     test_cases[i].data_len,
                     NULL,
                     test_cases[i].expected))
            ret = 1;
    }

    for(i = 0; i < FAILED_MALLOC_TEST_CASES_LEN; i++) {
        int tc =  i + TEST_CASES_LEN + 1;
        int malloc_call_num = 3 + i;
        if(test_case(tc,
                     failed_malloc_test_cases[i].data,
                     failed_malloc_test_cases[i].data_len,
                     &malloc_call_num,
                     failed_malloc_test_cases[i].expected))
            ret = 1;
    }

    return ret;
}